

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int vm_builtin_parse_url(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxi32 sVar1;
  int iVar2;
  char *zUri;
  jx9_value *pArray;
  jx9_value *pVal;
  undefined8 in_RCX;
  char **zRest;
  SyBlob *pBlob;
  int iPort;
  int nLen;
  SyhttpUri sURI;
  
  if ((((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) ||
      (zUri = jx9_value_to_string(*apArg,&nLen), nLen < 1)) ||
     (sVar1 = VmHttpSplitURI(&sURI,zUri,nLen), sVar1 != 0)) {
LAB_001276e2:
    jx9_result_bool(pCtx,0);
    return 0;
  }
  if (nArg == 1) {
    pArray = jx9_context_new_array(pCtx);
    pVal = jx9_context_new_scalar(pCtx);
    zRest = (char **)CONCAT71((int7)((ulong)in_RCX >> 8),pVal != (jx9_value *)0x0);
    if (pArray != (jx9_value *)0x0 && pVal != (jx9_value *)0x0) {
      if (sURI.sScheme.nByte != 0) {
        jx9_value_string(pVal,sURI.sScheme.zString,sURI.sScheme.nByte);
        jx9_array_add_strkey_elem(pArray,"scheme",pVal);
      }
      pBlob = &pVal->sBlob;
      SyBlobReset(pBlob);
      if (sURI.sHost.nByte != 0) {
        jx9_value_string(pVal,sURI.sHost.zString,sURI.sHost.nByte);
        jx9_array_add_strkey_elem(pArray,"host",pVal);
      }
      SyBlobReset(pBlob);
      if (sURI.sPort.nByte != 0) {
        iPort = 0;
        SyStrToInt32(sURI.sPort.zString,sURI.sPort.nByte,&iPort,zRest);
        jx9_value_int(pVal,iPort);
        jx9_array_add_strkey_elem(pArray,"port",pVal);
      }
      SyBlobReset(pBlob);
      if (sURI.sUser.nByte != 0) {
        jx9_value_string(pVal,sURI.sUser.zString,sURI.sUser.nByte);
        jx9_array_add_strkey_elem(pArray,"user",pVal);
      }
      SyBlobReset(pBlob);
      if (sURI.sPass.nByte != 0) {
        jx9_value_string(pVal,sURI.sPass.zString,sURI.sPass.nByte);
        jx9_array_add_strkey_elem(pArray,"pass",pVal);
      }
      SyBlobReset(pBlob);
      if (sURI.sPath.nByte != 0) {
        jx9_value_string(pVal,sURI.sPath.zString,sURI.sPath.nByte);
        jx9_array_add_strkey_elem(pArray,"path",pVal);
      }
      SyBlobReset(pBlob);
      if (sURI.sQuery.nByte != 0) {
        jx9_value_string(pVal,sURI.sQuery.zString,sURI.sQuery.nByte);
        jx9_array_add_strkey_elem(pArray,"query",pVal);
      }
      SyBlobReset(pBlob);
      if (sURI.sFragment.nByte != 0) {
        jx9_value_string(pVal,sURI.sFragment.zString,sURI.sFragment.nByte);
        jx9_array_add_strkey_elem(pArray,"fragment",pVal);
      }
      jx9_result_value(pCtx,pArray);
      return 0;
    }
    jx9_context_throw_error(pCtx,1,"jx9 engine is running out of memory");
    goto LAB_001276e2;
  }
  iVar2 = jx9_value_to_int(apArg[1]);
  switch(iVar2) {
  case 1:
    sURI.sUser.zString = sURI.sScheme.zString;
    sURI.sUser.nByte = sURI.sScheme.nByte;
    break;
  case 2:
    sURI.sUser.zString = sURI.sHost.zString;
    sURI.sUser.nByte = sURI.sHost.nByte;
    break;
  case 3:
    if (sURI.sPort.nByte != 0) {
      iPort = 0;
      SyStrToInt32(sURI.sPort.zString,sURI.sPort.nByte,&iPort,
                   (char **)&switchD_001278f3::switchdataD_001398fc);
      jx9_result_int(pCtx,iPort);
      return 0;
    }
    goto switchD_001278f3_default;
  case 4:
    break;
  case 5:
    sURI.sUser.zString = sURI.sPass.zString;
    sURI.sUser.nByte = sURI.sPass.nByte;
    break;
  case 6:
    sURI.sUser.zString = sURI.sPath.zString;
    sURI.sUser.nByte = sURI.sPath.nByte;
    break;
  case 7:
    sURI.sUser.zString = sURI.sQuery.zString;
    sURI.sUser.nByte = sURI.sQuery.nByte;
    break;
  case 8:
    sURI.sUser.zString = sURI.sFragment.zString;
    sURI.sUser.nByte = sURI.sFragment.nByte;
    break;
  default:
    goto switchD_001278f3_default;
  }
  if (sURI.sUser.nByte == 0) {
switchD_001278f3_default:
    jx9_result_null(pCtx);
  }
  else {
    jx9_result_string(pCtx,sURI.sUser.zString,sURI.sUser.nByte);
  }
  return 0;
}

Assistant:

static int vm_builtin_parse_url(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zStr; /* Input string */
	SyString *pComp;  /* Pointer to the URI component */
	SyhttpUri sURI;   /* Parse of the given URI */
	int nLen;
	sxi32 rc;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the given URI */
	zStr = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Nothing to process, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Get a parse */
	rc = VmHttpSplitURI(&sURI, zStr, (sxu32)nLen);
	if( rc != SXRET_OK ){
		/* Malformed input, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( nArg > 1 ){
		int nComponent = jx9_value_to_int(apArg[1]);
		/* Refer to constant.c for constants values */
		switch(nComponent){
		case 1: /* JX9_URL_SCHEME */
			pComp = &sURI.sScheme;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		case 2: /* JX9_URL_HOST */
			pComp = &sURI.sHost;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		case 3: /* JX9_URL_PORT */
			pComp = &sURI.sPort;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				int iPort = 0;
				/* Cast the value to integer */
				SyStrToInt32(pComp->zString, pComp->nByte, (void *)&iPort, 0);
				jx9_result_int(pCtx, iPort);
			}
			break;
		case 4: /* JX9_URL_USER */
			pComp = &sURI.sUser;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		case 5: /* JX9_URL_PASS */
			pComp = &sURI.sPass;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		case 7: /* JX9_URL_QUERY */
			pComp = &sURI.sQuery;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		case 8: /* JX9_URL_FRAGMENT */
			pComp = &sURI.sFragment;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		case 6: /*  JX9_URL_PATH */
			pComp = &sURI.sPath;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		default:
			/* No such entry, return NULL */
			jx9_result_null(pCtx);
			break;
		}
	}else{
		jx9_value *pArray, *pValue;
		/* Return an associative array */
		pArray = jx9_context_new_array(pCtx);  /* Empty array */
		pValue = jx9_context_new_scalar(pCtx); /* Array value */
		if( pArray == 0 || pValue == 0 ){
			/* Out of memory */
			jx9_context_throw_error(pCtx, JX9_CTX_ERR, "jx9 engine is running out of memory");
			/* Return false */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Fill the array */
		pComp = &sURI.sScheme;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "scheme", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sHost;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "host", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sPort;
		if( pComp->nByte > 0 ){
			int iPort = 0;/* cc warning */
			/* Convert to integer */
			SyStrToInt32(pComp->zString, pComp->nByte, (void *)&iPort, 0);
			jx9_value_int(pValue, iPort);
			jx9_array_add_strkey_elem(pArray, "port", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sUser;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "user", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sPass;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "pass", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sPath;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "path", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sQuery;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "query", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sFragment;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "fragment", pValue); /* Will make it's own copy */
		}
		/* Return the created array */
		jx9_result_value(pCtx, pArray);
		/* NOTE:
		 * Don't worry about freeing 'pValue', everything will be released
		 * automatically as soon we return from this function.
		 */
	}
	/* All done */
	return JX9_OK;
}